

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringInternalCache.cpp
# Opt level: O1

SimpleStringInternalCacheNode * __thiscall
SimpleStringInternalCache::createInternalCacheNodes(SimpleStringInternalCache *this)

{
  undefined8 *puVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar4;
  SimpleStringInternalCacheNode *pSVar3;
  
  iVar2 = (*this->allocator_->_vptr_TestMemoryAllocator[2])
                    (this->allocator_,0x78,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/SimpleStringInternalCache.cpp"
                     ,0x3f);
  pSVar3 = (SimpleStringInternalCacheNode *)CONCAT44(extraout_var,iVar2);
  lVar4 = 8;
  do {
    puVar1 = (undefined8 *)((long)&pSVar3->size_ + lVar4);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x80);
  pSVar3->size_ = 0x20;
  pSVar3[1].size_ = 0x40;
  pSVar3[2].size_ = 0x60;
  pSVar3[3].size_ = 0x80;
  pSVar3[4].size_ = 0x100;
  return pSVar3;
}

Assistant:

SimpleStringInternalCacheNode* SimpleStringInternalCache::createInternalCacheNodes()
{
    SimpleStringInternalCacheNode* node = (SimpleStringInternalCacheNode*) (void*) allocator_->alloc_memory(sizeof(SimpleStringInternalCacheNode) * amountOfInternalCacheNodes, __FILE__, __LINE__);

    for (int i = 0; i < amountOfInternalCacheNodes; i++) {
        node[i].freeMemoryHead_ = NULLPTR;
        node[i].usedMemoryHead_ = NULLPTR;
    }
    node[0].size_ = 32;
    node[1].size_ = 64;
    node[2].size_ = 96;
    node[3].size_ = 128;
    node[4].size_ = 256;
    return node;
}